

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

boundaries __thiscall fmt::v6::internal::fp::assign_float_with_boundaries<double>(fp *this,double d)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong in_R10;
  boundaries bVar6;
  
  uVar2 = (ulong)d & 0xfffffffffffff;
  this->f = uVar2;
  uVar3 = (ulong)d >> 0x34 & 0x7ff;
  if (uVar3 == 0) {
    iVar5 = -0x432;
  }
  else {
    uVar2 = uVar2 | 0x10000000000000;
    this->f = uVar2;
    iVar5 = (int)uVar3 + -0x433;
    in_R10 = 0x10000000L << (0x81U - (char)uVar3 & 0x3f);
    if (0x380 < uVar3) {
      in_R10 = 0x10000000;
    }
  }
  this->e = iVar5;
  uVar3 = uVar2 + in_R10;
  iVar4 = iVar5;
  if ((uVar3 & 0x10000000000000) == 0) {
    lVar1 = 0x3f;
    if ((uVar3 & 0xfffffffffffff) != 0) {
      for (; (uVar3 & 0xfffffffffffff) >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar3 = uVar3 << (~(byte)lVar1 + 0x35 & 0x3f);
    iVar4 = (iVar5 + 0xb) - ((uint)lVar1 ^ 0x3f);
  }
  bVar6.upper = uVar3 << 0xb;
  bVar6.lower = uVar2 - (in_R10 >> (-0xb2 < iVar5 && uVar2 == 0x10000000000000)) <<
                (((char)iVar5 + '\v') - (char)iVar4 & 0x3fU);
  return bVar6;
}

Assistant:

boundaries assign_float_with_boundaries(Double d) {
    assign(d);
    constexpr int min_normal_e = std::numeric_limits<float>::min_exponent -
                                 std::numeric_limits<double>::digits;
    significand_type half_ulp = 1 << (std::numeric_limits<double>::digits -
                                      std::numeric_limits<float>::digits - 1);
    if (min_normal_e > e) half_ulp <<= min_normal_e - e;
    fp upper = normalize<0>(fp(f + half_ulp, e));
    fp lower = fp(
        f - (half_ulp >> ((f == implicit_bit && e > min_normal_e) ? 1 : 0)), e);
    lower.f <<= lower.e - upper.e;
    return boundaries{lower.f, upper.f};
  }